

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int http_compress_open(char *url,int rwmode,int *handle)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char firstchar;
  int status;
  int flen;
  int ii;
  int contentlength;
  long len;
  char recbuf [1200];
  char errorstr [1200];
  char contenttype [100];
  char local_98 [8];
  char contentencoding [100];
  FILE *httpfile;
  int *handle_local;
  int rwmode_local;
  char *url_local;
  
  closehttpfile = 0;
  closediskfile = 0;
  closefdiskfile = 0;
  closememfile = 0;
  sVar3 = strlen(netoutfile);
  if ((int)sVar3 == 0) {
    ffpmsg("Output file not set, shouldn\'t have happened (http_compress_open)");
  }
  else if (rwmode == 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)env);
    if (iVar1 == 0) {
      signal(0xe,signal_handler);
      alarm(net_timeout);
      iVar1 = http_open_network(url,(FILE **)(contentencoding + 0x60),local_98,errorstr + 0x4a8,
                                &flen);
      if (iVar1 == 0) {
        closehttpfile = closehttpfile + 1;
        iVar1 = fgetc(stack0xffffffffffffffd0);
        ungetc((int)(char)iVar1,stack0xffffffffffffffd0);
        iVar2 = strcmp(local_98,"x-gzip");
        if ((((((iVar2 == 0) || (iVar2 = strcmp(local_98,"x-compress"), iVar2 == 0)) ||
              (iVar2 = strcmp(errorstr + 0x4a8,"application/x-gzip"), iVar2 == 0)) ||
             ((iVar2 = strcmp(errorstr + 0x4a8,"application/gzip"), iVar2 == 0 ||
              (iVar2 = strcmp(errorstr + 0x4a8,"application/gzip-compressed"), iVar2 == 0)))) ||
            ((iVar2 = strcmp(errorstr + 0x4a8,"application/gzipped"), iVar2 == 0 ||
             ((iVar2 = strcmp(errorstr + 0x4a8,"application/x-compress"), iVar2 == 0 ||
              (iVar2 = strcmp(errorstr + 0x4a8,"application/x-compressed"), iVar2 == 0)))))) ||
           ((char)iVar1 == '\x1f')) {
          if (netoutfile[0] == '!') {
            for (status = 0; status < (int)sVar3; status = status + 1) {
              netoutfile[status] = netoutfile[status + 1];
            }
            file_remove(netoutfile);
          }
          iVar1 = file_create(netoutfile,handle);
          if (iVar1 == 0) {
            closediskfile = closediskfile + 1;
            alarm(net_timeout);
            while (_ii = fread(&len,1,0x4b0,stack0xffffffffffffffd0), _ii != 0) {
              alarm(0);
              iVar1 = file_write(*handle,&len,_ii);
              if (iVar1 != 0) {
                ffpmsg("Error writing disk file (http_compres_open)");
                ffpmsg(netoutfile);
                goto LAB_0013cd8d;
              }
              alarm(net_timeout);
            }
            file_close(*handle);
            fclose(stack0xffffffffffffffd0);
            closehttpfile = closehttpfile + -1;
            closediskfile = closediskfile + -1;
            diskfile = (FILE *)fopen(netoutfile,"r");
            if ((FILE *)diskfile == (FILE *)0x0) {
              ffpmsg("Unable to reopen disk file (http_compress_open)");
              ffpmsg(netoutfile);
            }
            else {
              closefdiskfile = closefdiskfile + 1;
              iVar1 = mem_create(url,handle);
              if (iVar1 == 0) {
                closememfile = closememfile + 1;
                iVar1 = mem_uncompress2mem(url,diskfile,*handle);
                fclose((FILE *)diskfile);
                closefdiskfile = closefdiskfile + -1;
                if (iVar1 == 0) {
                  signal(0xe,(__sighandler_t)0x0);
                  alarm(0);
                  iVar1 = mem_seek(*handle,0);
                  return iVar1;
                }
                ffpmsg("Error uncompressing disk file to memory (http_compress_open)");
                ffpmsg(netoutfile);
              }
              else {
                ffpmsg("Unable to create memory file (http_compress_open)");
              }
            }
          }
          else {
            ffpmsg("Unable to create output disk file (http_compress_open):");
            ffpmsg(netoutfile);
          }
        }
        else {
          ffpmsg("Can only have compressed files here (http_compress_open)");
        }
      }
      else {
        alarm(0);
        ffpmsg("Unable to open http file (http_compress_open)");
        ffpmsg(url);
      }
    }
    else {
      ffpmsg("Timeout (http_open)");
      snprintf(recbuf + 0x4a8,0x4b0,"Download timeout exceeded: %d seconds",(ulong)net_timeout);
      ffpmsg(recbuf + 0x4a8);
      ffpmsg("   Timeout may be adjusted with fits_set_timeout");
    }
  }
  else {
    ffpmsg("Can\'t open compressed http:// type file with READWRITE access");
    ffpmsg("  Specify an UNCOMPRESSED outfile (http_compress_open)");
  }
LAB_0013cd8d:
  alarm(0);
  if (closehttpfile != 0) {
    fclose(stack0xffffffffffffffd0);
  }
  if (closefdiskfile != 0) {
    fclose((FILE *)diskfile);
  }
  if (closememfile != 0) {
    mem_close_free(*handle);
  }
  if (closediskfile != 0) {
    file_close(*handle);
  }
  signal(0xe,(__sighandler_t)0x0);
  return 0x68;
}

Assistant:

int http_compress_open(char *url, int rwmode, int *handle)
{
  FILE *httpfile;
  char contentencoding[SHORTLEN], contenttype[SHORTLEN];
  char errorstr[MAXLEN];
  char recbuf[MAXLEN];
  long len;
  int contentlength;
  int ii, flen, status;
  char firstchar;

  closehttpfile = 0;
  closediskfile = 0;
  closefdiskfile = 0;
  closememfile = 0;

  flen = strlen(netoutfile);
  if (!flen)  {
     /* cfileio made a mistake, should set the netoufile first otherwise 
        we don't know where to write the output file */
     ffpmsg
	("Output file not set, shouldn't have happened (http_compress_open)");
      goto error;
  }

  if (rwmode != 0) {
    ffpmsg("Can't open compressed http:// type file with READWRITE access");
    ffpmsg("  Specify an UNCOMPRESSED outfile (http_compress_open)");
    goto error;
  }
  /* do the signal handler bits */
  if (setjmp(env) != 0) {
    /* feels like the second time */
    /* this means something bad happened */
    ffpmsg("Timeout (http_open)");
    snprintf(errorstr, MAXLEN, "Download timeout exceeded: %d seconds",net_timeout);
    ffpmsg(errorstr);
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
    goto error;
  }

  signal(SIGALRM, signal_handler);
  
  /* Open the http connectin */
  alarm(net_timeout);
  if ((status = http_open_network(url,&httpfile, contentencoding, 
				  contenttype, &contentlength))) {
    alarm(0);
    ffpmsg("Unable to open http file (http_compress_open)");
    ffpmsg(url);
    goto error;
  }

  closehttpfile++;

  /* Better be compressed */

  firstchar = fgetc(httpfile);
  ungetc(firstchar,httpfile);
  if (!strcmp(contentencoding,"x-gzip") || 
      !strcmp(contentencoding,"x-compress") ||
      !strcmp(contenttype, "application/x-gzip") ||
      !strcmp(contenttype, "application/gzip") ||
      !strcmp(contenttype, "application/gzip-compressed") ||
      !strcmp(contenttype, "application/gzipped") ||
      !strcmp(contenttype, "application/x-compress") ||
      !strcmp(contenttype, "application/x-compressed") ||
      ('\037' == firstchar)) {

    if (*netoutfile == '!')
    {
       /* user wants to clobber file, if it already exists */
       for (ii = 0; ii < flen; ii++)
           netoutfile[ii] = netoutfile[ii + 1];  /* remove '!' */

       status = file_remove(netoutfile);
    }

    /* Create the new file */
    if ((status =  file_create(netoutfile,handle))) {
      ffpmsg("Unable to create output disk file (http_compress_open):");
      ffpmsg(netoutfile);
      goto error;
    }
    
    closediskfile++;

    /* write a file */
    alarm(net_timeout);
    while(0 != (len = fread(recbuf,1,MAXLEN,httpfile))) {
      alarm(0);
      status = file_write(*handle,recbuf,len);
      if (status) {
	ffpmsg("Error writing disk file (http_compres_open)");
        ffpmsg(netoutfile);
	goto error;
      }
      alarm(net_timeout);
    }
    file_close(*handle);
    fclose(httpfile);
    closehttpfile--;
    closediskfile--;

    /* File is on disk, let's uncompress it into memory */

    if (NULL == (diskfile = fopen(netoutfile,"r"))) {
      ffpmsg("Unable to reopen disk file (http_compress_open)");
      ffpmsg(netoutfile);
      goto error;
    }
    closefdiskfile++;

    /* Create the memory handle to hold it */
    if ((status =  mem_create(url,handle))) {
      ffpmsg("Unable to create memory file (http_compress_open)");
      goto error;
    }
    closememfile++;

    /* Uncompress it */
    status = 0;
    status = mem_uncompress2mem(url,diskfile,*handle);
    fclose(diskfile);
    closefdiskfile--;
    if (status) {
      ffpmsg("Error uncompressing disk file to memory (http_compress_open)");
      ffpmsg(netoutfile);
      goto error;
    }
      
  } else {
    /* Opps, this should not have happened */
    ffpmsg("Can only have compressed files here (http_compress_open)");
    goto error;
  }    
    
  signal(SIGALRM, SIG_DFL);
  alarm(0);
  return mem_seek(*handle,0);

 error:
  alarm(0); /* clear it */
  if (closehttpfile) {
    fclose(httpfile);
  }
  if (closefdiskfile) {
    fclose(diskfile);
  }
  if (closememfile) {
    mem_close_free(*handle);
  }
  if (closediskfile) {
    file_close(*handle);
  } 
  
  signal(SIGALRM, SIG_DFL);
  return (FILE_NOT_OPENED);
}